

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void __thiscall
absl::lts_20250127::internal_any_invocable::CoreImpl<false,void>::
InitializeStorage<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1&,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1,void>
          (CoreImpl<false,void> *this,anon_class_16_2_0454c2e6 *args)

{
  anon_class_16_2_0454c2e6 *args_local;
  CoreImpl<false,_void> *this_local;
  
  *(FieldGenerator **)this = args->generator;
  *(Printer ***)(this + 8) = args->p;
  *(code **)(this + 0x18) =
       LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1&>
  ;
  InitializeLocalManager<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1,void>
            (this);
  return;
}

Assistant:

void InitializeStorage(Args&&... args) {
    using RawT = RemoveCVRef<QualTRef>;
    ::new (static_cast<void*>(&state_.storage))
        RawT(std::forward<Args>(args)...);

    invoker_ = LocalInvoker<SigIsNoexcept, ReturnType, QualTRef, P...>;
    // We can simplify our manager if we know the type is trivially copyable.
    InitializeLocalManager<RawT>();
  }